

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sisd_alignment_engine.cpp
# Opt level: O3

Alignment * __thiscall
spoa::SisdAlignmentEngine::Convex
          (Alignment *__return_storage_ptr__,SisdAlignmentEngine *this,uint32_t sequence_len,
          Graph *graph,int32_t *score)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  uint uVar5;
  uint uVar6;
  pointer ppNVar7;
  Implementation *pIVar8;
  Node *pNVar9;
  pointer ppEVar10;
  pointer ppEVar11;
  int32_t *piVar12;
  pointer ppVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  byte bVar17;
  Edge **it;
  long lVar18;
  int32_t *piVar19;
  pointer ppEVar20;
  pointer ppVar21;
  uint uVar22;
  long lVar23;
  pointer ppVar24;
  uint uVar25;
  ulong uVar27;
  pointer ppEVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  pointer ppEVar32;
  ulong uVar33;
  AlignmentType AVar34;
  int32_t *piVar35;
  ulong uVar36;
  uint uVar37;
  int iVar38;
  uint uVar39;
  ulong uVar40;
  int iVar41;
  int32_t *local_138;
  int32_t *local_118;
  uint local_fc;
  pointer local_f8;
  int local_ec;
  int32_t *local_e8;
  pointer local_e0;
  uint local_d8;
  uint local_d4;
  AlignmentType local_d0;
  uint local_cc;
  Graph *local_c8;
  int32_t *local_c0;
  long local_b8;
  int32_t *local_b0;
  int32_t *local_a8;
  int32_t *local_a0;
  int32_t *local_98;
  ulong local_90;
  Node *local_88;
  long local_80;
  long local_78;
  pointer local_70;
  int32_t *local_68;
  int32_t *local_60;
  int32_t *local_58;
  int32_t *local_50;
  pointer local_48;
  pointer local_40;
  int32_t *local_38;
  ulong uVar26;
  
  AVar34 = (this->super_AlignmentEngine).type_;
  local_48 = (graph->rank_to_node_).
             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppNVar7 = (graph->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar25 = sequence_len + 1;
  uVar26 = (ulong)uVar25;
  uVar39 = 0x80000400;
  if (AVar34 == kSW) {
    uVar39 = 0;
  }
  if (ppNVar7 == local_48) {
    ppEVar32 = (pointer)0x0;
    local_118 = (int32_t *)0x0;
  }
  else {
    iVar29 = (int)(this->super_AlignmentEngine).e_;
    pIVar8 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    local_ec = (int)(this->super_AlignmentEngine).g_;
    local_b8 = uVar26 * 4;
    local_98 = (int32_t *)(uVar26 - 1);
    local_a0 = (int32_t *)(uVar26 * 4 + -4);
    iVar30 = (int)(this->super_AlignmentEngine).q_;
    local_78 = *(long *)&(pIVar8->node_id_to_rank).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
    local_50 = pIVar8->H;
    local_118 = (int32_t *)0x0;
    local_e8 = (int32_t *)CONCAT44(local_e8._4_4_,iVar30);
    iVar31 = (int)(this->super_AlignmentEngine).c_;
    local_80 = *(long *)&(pIVar8->sequence_profile).super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl + 4;
    local_c0 = local_50 + 1;
    local_b0 = pIVar8->O + 1;
    local_a8 = pIVar8->F + 1;
    local_38 = (int32_t *)(uVar26 - 2);
    local_60 = pIVar8->Q + 1;
    local_58 = pIVar8->E + 1;
    ppEVar32 = (pointer)0x0;
    do {
      local_cc = uVar39;
      local_40 = ppNVar7;
      local_88 = *local_40;
      local_70 = (local_88->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar28 = (local_88->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_70 == ppEVar28) {
        uVar40 = 0;
      }
      else {
        uVar40 = (ulong)(*(int *)(local_78 + (ulong)(*local_70)->tail->id * 4) + 1);
      }
      uVar39 = local_88->code;
      local_d8 = *(int *)(local_78 + (ulong)local_88->id * 4) + 1;
      local_90 = (ulong)local_d8;
      if (1 < uVar25) {
        lVar23 = local_b8 * local_90;
        lVar18 = uVar40 * local_b8;
        piVar19 = (int32_t *)(lVar18 + (long)local_c0);
        piVar35 = (int32_t *)0x0;
        do {
          iVar41 = *(int *)((long)((long)local_a8 + lVar18) + (long)piVar35) + iVar29;
          iVar38 = *(int *)((long)piVar19 + (long)piVar35) + local_ec;
          if (iVar41 < iVar38) {
            iVar41 = iVar38;
          }
          *(int *)((long)(lVar23 + (long)local_a8) + (long)piVar35) = iVar41;
          iVar38 = *(int *)((long)piVar19 + (long)piVar35) + iVar30;
          iVar41 = *(int *)((long)((long)local_b0 + lVar18) + (long)piVar35) + iVar31;
          if (iVar41 < iVar38) {
            iVar41 = iVar38;
          }
          *(int *)((long)((long)local_b0 + lVar23) + (long)piVar35) = iVar41;
          *(int *)((long)((long)local_c0 + lVar23) + (long)piVar35) =
               *(int *)(local_b8 * (ulong)uVar39 + local_80 + (long)piVar35) +
               *(int *)((long)(piVar19 + -1) + (long)piVar35);
          piVar35 = piVar35 + 1;
        } while (local_a0 != piVar35);
      }
      local_f8 = (pointer)((long)ppEVar28 - (long)local_70 >> 3);
      if ((pointer)0x1 < local_f8) {
        cVar1 = (this->super_AlignmentEngine).g_;
        cVar2 = (this->super_AlignmentEngine).e_;
        cVar3 = (this->super_AlignmentEngine).q_;
        cVar4 = (this->super_AlignmentEngine).c_;
        lVar18 = local_b8 * local_90;
        ppEVar28 = (pointer)0x1;
        do {
          local_e0 = ppEVar28;
          if (1 < uVar25) {
            piVar35 = (int32_t *)0x0;
            lVar23 = (ulong)(*(int *)(local_78 + (ulong)local_70[(long)local_e0]->tail->id * 4) + 1)
                     * local_b8;
            piVar19 = (int32_t *)(lVar23 + (long)local_c0);
            do {
              iVar38 = *(int *)((long)piVar19 + (long)piVar35) + (int)cVar1;
              iVar41 = *(int *)((long)((long)local_a8 + lVar23) + (long)piVar35) + (int)cVar2;
              if (iVar41 < iVar38) {
                iVar41 = iVar38;
              }
              iVar38 = *(int *)(lVar18 + (long)local_a8 + (long)piVar35);
              if (iVar41 < iVar38) {
                iVar41 = iVar38;
              }
              *(int *)((long)(lVar18 + (long)local_a8) + (long)piVar35) = iVar41;
              iVar38 = *(int *)((long)piVar19 + (long)piVar35) + (int)cVar3;
              iVar41 = *(int *)((long)((long)local_b0 + lVar23) + (long)piVar35) + (int)cVar4;
              if (iVar41 < iVar38) {
                iVar41 = iVar38;
              }
              iVar38 = *(int *)((long)local_b0 + lVar18 + (long)piVar35);
              if (iVar41 < iVar38) {
                iVar41 = iVar38;
              }
              *(int *)((long)((long)local_b0 + lVar18) + (long)piVar35) = iVar41;
              iVar41 = *(int *)((long)local_c0 + lVar18 + (long)piVar35);
              iVar38 = *(int *)((ulong)uVar39 * local_b8 + local_80 + (long)piVar35) +
                       *(int *)((long)(piVar19 + -1) + (long)piVar35);
              if (iVar38 < iVar41) {
                iVar38 = iVar41;
              }
              *(int *)((long)((long)local_c0 + lVar18) + (long)piVar35) = iVar38;
              piVar35 = piVar35 + 1;
            } while (local_a0 != piVar35);
          }
          ppEVar28 = (pointer)(ulong)((int)local_e0 + 1);
        } while (ppEVar28 < local_f8);
      }
      uVar39 = local_cc;
      if (1 < uVar25) {
        uVar40 = 1;
        piVar19 = (int32_t *)0x0;
        lVar18 = local_b8 * local_90;
        local_e0 = (pointer)(local_50 + local_90 * uVar26);
        uVar37 = *(uint *)local_e0;
        do {
          iVar41 = *(int *)((long)local_58 + (long)piVar19 * 4 + lVar18 + -4) + iVar29;
          if (iVar41 < (int)(uVar37 + local_ec)) {
            iVar41 = uVar37 + local_ec;
          }
          *(int *)((long)local_58 + (long)piVar19 * 4 + lVar18) = iVar41;
          uVar22 = *(int *)((long)local_c0 + (long)piVar19 * 4 + lVar18 + -4) + iVar30;
          uVar37 = *(int *)((long)local_60 + (long)piVar19 * 4 + lVar18 + -4) + iVar31;
          if ((int)uVar37 < (int)uVar22) {
            uVar37 = uVar22;
          }
          *(uint *)((long)local_60 + (long)piVar19 * 4 + lVar18) = uVar37;
          uVar22 = *(uint *)((long)local_a8 + (long)piVar19 * 4 + lVar18);
          uVar5 = *(uint *)((long)local_58 + (long)piVar19 * 4 + lVar18);
          uVar6 = *(uint *)((long)local_b0 + (long)piVar19 * 4 + lVar18);
          if ((int)uVar5 < (int)uVar22) {
            uVar5 = uVar22;
          }
          if ((int)uVar37 < (int)uVar6) {
            uVar37 = uVar6;
          }
          uVar22 = *(uint *)((long)local_c0 + (long)piVar19 * 4 + lVar18);
          if ((int)uVar37 < (int)uVar5) {
            uVar37 = uVar5;
          }
          if ((int)uVar37 < (int)uVar22) {
            uVar37 = uVar22;
          }
          *(uint *)((long)local_c0 + (long)piVar19 * 4 + lVar18) = uVar37;
          if (AVar34 == kOV) {
            if (((local_88->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (local_88->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish) && ((int)uVar39 < (int)uVar37)) {
              local_118 = (int32_t *)(ulong)((int)piVar19 + 1);
              ppEVar32 = (pointer)(ulong)local_d8;
              uVar39 = uVar37;
            }
          }
          else if (AVar34 == kNW) {
            if (((local_38 == piVar19) &&
                ((local_88->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 (local_88->outedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish)) &&
               (uVar37 = *(uint *)((long)local_e0 + (uVar26 - 1) * 4), (int)uVar39 < (int)uVar37)) {
              ppEVar32 = (pointer)(ulong)local_d8;
              local_118 = local_98;
              uVar39 = uVar37;
            }
          }
          else if (AVar34 == kSW) {
            uVar37 = ~((int)uVar37 >> 0x1f) & uVar37;
            *(uint *)((long)local_c0 + (long)piVar19 * 4 + lVar18) = uVar37;
            if ((int)uVar39 < (int)uVar37) {
              ppEVar32 = (pointer)(ulong)local_d8;
              local_118 = (int32_t *)(uVar40 & 0xffffffff);
              uVar39 = uVar37;
            }
          }
          uVar40 = uVar40 + 1;
          piVar19 = (int32_t *)((long)piVar19 + 1);
        } while (local_98 != piVar19);
      }
      ppNVar7 = local_40 + 1;
      local_d0 = AVar34;
    } while (local_40 + 1 != local_48);
  }
  if ((int)ppEVar32 == 0 && (int)local_118 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  if (score != (int32_t *)0x0) {
    *score = uVar39;
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = (int32_t *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppEVar28 = (pointer)0x0;
  local_c8 = graph;
  local_68 = score;
  do {
    iVar29 = (int)ppEVar32;
    uVar39 = (uint)local_118;
    uVar40 = (ulong)local_118 & 0xffffffff;
    if (AVar34 == kOV) {
      uVar25 = uVar39;
      if (iVar29 == 0) goto LAB_00118db8;
joined_r0x00118777:
      if (uVar25 == 0) goto LAB_00118db8;
    }
    else {
      if (AVar34 != kNW) {
        if (AVar34 == kSW) {
          uVar25 = ((this->pimpl_)._M_t.
                    super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                    .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl)->H[(long)ppEVar32 * uVar26 + uVar40];
          goto joined_r0x00118777;
        }
LAB_00118db8:
        ppVar21 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        ppVar13 = (__return_storage_ptr__->
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        ppVar24 = ppVar13 + -1;
        if (ppVar24 <= ppVar21 || ppVar21 == ppVar13) {
          return __return_storage_ptr__;
        }
        do {
          iVar29 = ppVar21->first;
          ppVar21->first = ppVar24->first;
          ppVar24->first = iVar29;
          iVar29 = ppVar21->second;
          ppVar21->second = ppVar24->second;
          ppVar24->second = iVar29;
          ppVar21 = ppVar21 + 1;
          ppVar24 = ppVar24 + -1;
        } while (ppVar21 < ppVar24);
        return __return_storage_ptr__;
      }
      if (iVar29 == 0 && uVar39 == 0) goto LAB_00118db8;
    }
    pIVar8 = (this->pimpl_)._M_t.
             super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             ._M_t.
             super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
             .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>._M_head_impl
    ;
    lVar18 = (long)ppEVar32 * uVar26;
    piVar19 = pIVar8->H;
    iVar30 = piVar19[lVar18 + uVar40];
    if ((uVar39 == 0) || (iVar29 == 0)) {
LAB_0011888f:
      if (iVar29 != 0) {
LAB_001188cf:
        pNVar9 = (local_c8->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar29 - 1];
        ppEVar10 = (pNVar9->inedges).
                   super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppEVar11 = *(pointer *)
                    ((long)&(pNVar9->inedges).
                            super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                            ._M_impl + 8);
        if (ppEVar10 == ppEVar11) {
          ppEVar20 = (pointer)0x0;
        }
        else {
          ppEVar20 = (pointer)(ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                                                                                  
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              + (ulong)(*ppEVar10)->tail->id * 4) + 1);
        }
        lVar23 = (long)ppEVar20 * uVar26;
        bVar14 = true;
        iVar31 = (int)(this->super_AlignmentEngine).e_;
        piVar35 = local_118;
        if (iVar30 != pIVar8->F[lVar23 + uVar40] + iVar31) {
          uVar25 = (uint)(this->super_AlignmentEngine).g_;
          local_e0 = (pointer)(ulong)uVar25;
          local_f8 = ppEVar11;
          if (iVar30 == uVar25 + piVar19[lVar23 + uVar40]) {
            bVar14 = false;
            piVar35 = local_118;
          }
          else {
            piVar12 = pIVar8->O;
            local_ec = (int)(this->super_AlignmentEngine).c_;
            piVar35 = local_118;
            local_e8 = piVar12;
            if (iVar30 != piVar12[lVar23 + uVar40] + local_ec) {
              iVar41 = (int)(this->super_AlignmentEngine).q_;
              piVar35 = local_118;
              if (iVar30 == piVar19[lVar23 + uVar40] + iVar41) goto LAB_0011882e;
              uVar33 = (long)ppEVar11 - (long)ppEVar10 >> 3;
              if (1 < uVar33) {
                local_f8 = (pointer)(pIVar8->F + uVar40);
                local_98 = piVar19 + uVar40;
                local_e8 = *(int32_t **)
                            &(pIVar8->node_id_to_rank).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>;
                local_a0 = piVar12 + uVar40;
                uVar27 = 1;
                uVar36 = 2;
                do {
                  lVar23 = (local_e8[ppEVar10[uVar27]->tail->id] + 1U) * uVar26;
                  if (iVar30 == *(int *)((long)local_f8 + lVar23 * 4) + iVar31) {
LAB_00118db0:
                    ppEVar20 = (pointer)(ulong)(local_e8[ppEVar10[uVar27]->tail->id] + 1U);
                    piVar35 = local_118;
                    goto LAB_00118a01;
                  }
                  if (iVar30 == uVar25 + local_98[lVar23]) {
LAB_00118da2:
                    bVar14 = false;
                    goto LAB_00118db0;
                  }
                  if (iVar30 == local_a0[lVar23] + local_ec) goto LAB_00118db0;
                  if (iVar30 == local_98[lVar23] + iVar41) goto LAB_00118da2;
                  bVar15 = uVar36 < uVar33;
                  uVar27 = uVar36;
                  uVar36 = (ulong)((int)uVar36 + 1);
                } while (bVar15);
              }
              goto LAB_00118896;
            }
          }
        }
        goto LAB_00118a01;
      }
LAB_00118896:
      if (uVar39 == 0) {
        bVar14 = false;
        ppEVar20 = ppEVar28;
        piVar35 = local_138;
        goto LAB_00118a01;
      }
      bVar15 = true;
      if (iVar30 == (int)(this->super_AlignmentEngine).e_ + pIVar8->E[lVar18 + (uVar40 - 1)]) {
LAB_00118a2e:
        bVar16 = bVar15;
        bVar14 = false;
        local_138 = (int32_t *)(ulong)(uVar39 - 1);
        ppEVar28 = ppEVar32;
      }
      else {
        if (iVar30 == (int)(this->super_AlignmentEngine).g_ + piVar19[lVar18 + (uVar40 - 1)]) {
          bVar15 = false;
          goto LAB_00118a2e;
        }
        if (iVar30 == (int)(this->super_AlignmentEngine).c_ + pIVar8->Q[lVar18 + (uVar40 - 1)])
        goto LAB_00118a2e;
        bVar14 = false;
        bVar16 = false;
        bVar15 = false;
        if (iVar30 == piVar19[lVar18 + (uVar40 - 1)] + (int)(this->super_AlignmentEngine).q_)
        goto LAB_00118a2e;
      }
    }
    else {
      pNVar9 = (local_c8->rank_to_node_).
               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl
               .super__Vector_impl_data._M_start[iVar29 - 1];
      ppEVar10 = (pNVar9->inedges).
                 super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppEVar11 = *(pointer *)
                  ((long)&(pNVar9->inedges).
                          super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                          ._M_impl + 8);
      if (ppEVar10 == ppEVar11) {
        ppEVar20 = (pointer)0x0;
      }
      else {
        ppEVar20 = (pointer)(ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            + (ulong)(*ppEVar10)->tail->id * 4) + 1);
      }
      iVar31 = *(int *)(pNVar9->code * uVar26 * 4 +
                        *(long *)&(pIVar8->sequence_profile).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl + uVar40 * 4
                       );
      piVar35 = (int32_t *)(ulong)(uVar39 - 1);
      if (iVar30 != piVar19[(long)((long)ppEVar20 * uVar26 + (long)piVar35)] + iVar31) {
        uVar33 = (long)ppEVar11 - (long)ppEVar10 >> 3;
        if (1 < uVar33) {
          uVar27 = 1;
          uVar36 = 2;
          do {
            uVar25 = *(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             + (ulong)ppEVar10[uVar27]->tail->id * 4) + 1;
            if (iVar30 == piVar19[(long)((long)piVar35 + uVar25 * uVar26)] + iVar31) {
              bVar14 = false;
              ppEVar20 = (pointer)(ulong)uVar25;
              goto LAB_00118a01;
            }
            bVar14 = uVar36 < uVar33;
            uVar27 = uVar36;
            uVar36 = (ulong)((int)uVar36 + 1);
          } while (bVar14);
          goto LAB_0011888f;
        }
        goto LAB_001188cf;
      }
LAB_0011882e:
      local_138 = piVar35;
      bVar14 = false;
      piVar35 = local_138;
LAB_00118a01:
      local_138 = piVar35;
      bVar16 = false;
      ppEVar28 = ppEVar20;
    }
    ppEVar32 = ppEVar28;
    local_fc = 0xffffffff;
    if (iVar29 != (int)ppEVar32) {
      local_fc = (local_c8->rank_to_node_).
                 super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[iVar29 - 1]->id;
    }
    local_d4 = uVar39 - 1;
    if (uVar39 == (uint)local_138) {
      local_d4 = 0xffffffff;
    }
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<unsigned_int,unsigned_int>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
               __return_storage_ptr__,&local_fc,&local_d4);
    if (bVar16) {
      lVar18 = (long)ppEVar32 * uVar26;
      uVar39 = (uint)local_138;
      do {
        do {
          uVar39 = uVar39 - 1;
          local_118 = (int32_t *)(ulong)uVar39;
          local_fc = 0xffffffff;
          local_d4 = uVar39;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<int,unsigned_int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,(int *)&local_fc,&local_d4);
          pIVar8 = (this->pimpl_)._M_t.
                   super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                   .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                   _M_head_impl;
          piVar19 = pIVar8->E;
        } while ((int)(this->super_AlignmentEngine).e_ + piVar19[(long)(lVar18 + (long)local_118)]
                 == piVar19[(long)local_118 + lVar18 + 1]);
        piVar19 = pIVar8->Q;
      } while ((int)(this->super_AlignmentEngine).c_ + piVar19[(long)(lVar18 + (long)local_118)] ==
               piVar19[(long)local_118 + lVar18 + 1]);
    }
    else {
      local_118 = local_138;
      if (bVar14) {
        uVar40 = (ulong)local_138 & 0xffffffff;
        ppEVar28 = ppEVar32;
        do {
          pNVar9 = (local_c8->rank_to_node_).
                   super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[(int)ppEVar28 - 1];
          ppEVar10 = (pNVar9->inedges).
                     super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          ppEVar11 = *(pointer *)
                      ((long)&(pNVar9->inedges).
                              super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                              ._M_impl + 8);
          if (ppEVar10 == ppEVar11) {
            ppEVar32 = (pointer)0x0;
            bVar17 = 1;
          }
          else {
            pIVar8 = (this->pimpl_)._M_t.
                     super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                     .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                     _M_head_impl;
            local_f8 = (pointer)(uVar40 * 4);
            ppEVar20 = ppEVar10;
            do {
              ppEVar32 = (pointer)(ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  + (ulong)(*ppEVar20)->tail->id * 4) + 1);
              local_e0 = ppEVar28;
              if ((*(int *)((long)local_f8 + (long)(pIVar8->F + (long)ppEVar28 * uVar26)) ==
                   *(int *)((long)local_f8 + (long)(pIVar8->F + (long)ppEVar32 * uVar26)) +
                   (int)(this->super_AlignmentEngine).e_) ||
                 (pIVar8->O[(long)ppEVar28 * uVar26 + uVar40] ==
                  pIVar8->O[(long)ppEVar32 * uVar26 + uVar40] +
                  (int)(this->super_AlignmentEngine).c_)) {
                bVar17 = 0;
                goto LAB_00118c93;
              }
              ppEVar20 = ppEVar20 + 1;
            } while (ppEVar20 != ppEVar11);
            if (ppEVar10 == ppEVar11) {
              ppEVar32 = (pointer)0x0;
            }
            else {
              pIVar8 = (this->pimpl_)._M_t.
                       super___uniq_ptr_impl<spoa::SisdAlignmentEngine::Implementation,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_std::default_delete<spoa::SisdAlignmentEngine::Implementation>_>
                       .super__Head_base<0UL,_spoa::SisdAlignmentEngine::Implementation_*,_false>.
                       _M_head_impl;
              do {
                ppEVar20 = ppEVar10 + 1;
                ppEVar32 = (pointer)(ulong)(*(int *)(*(long *)&(pIVar8->node_id_to_rank).
                                                                                                                              
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  + (ulong)(*ppEVar10)->tail->id * 4) + 1);
                iVar29 = *(int *)((long)local_f8 + (long)(pIVar8->H + (long)ppEVar32 * uVar26));
                if ((pIVar8->F[(long)ppEVar28 * uVar26 + uVar40] ==
                     iVar29 + (this->super_AlignmentEngine).g_) ||
                   (pIVar8->O[(long)ppEVar28 * uVar26 + uVar40] ==
                    iVar29 + (this->super_AlignmentEngine).q_)) break;
                ppEVar32 = (pointer)0x0;
                ppEVar10 = ppEVar20;
              } while (ppEVar20 != ppEVar11);
            }
            bVar17 = 1;
          }
LAB_00118c93:
          local_fc = 0xffffffff;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
          emplace_back<unsigned_int&,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                     __return_storage_ptr__,&pNVar9->id,(int *)&local_fc);
          ppEVar28 = ppEVar32;
        } while (!(bool)(bVar17 | (int)ppEVar32 == 0));
      }
    }
    AVar34 = (this->super_AlignmentEngine).type_;
    ppEVar28 = ppEVar32;
  } while( true );
}

Assistant:

Alignment SisdAlignmentEngine::Convex(
    std::uint32_t sequence_len,
    const Graph& graph,
    std::int32_t* score) noexcept {
  std::uint64_t matrix_width = sequence_len + 1;
  const auto& rank_to_node = graph.rank_to_node();

  std::int32_t max_score = type_ == AlignmentType::kSW ? 0 : kNegativeInfinity;
  std::uint32_t max_i = 0;
  std::uint32_t max_j = 0;
  auto update_max_score = [&max_score, &max_i, &max_j] (
      std::int32_t* H_row,
      std::uint32_t i,
      std::uint32_t j) -> void {
    if (max_score < H_row[j]) {
      max_score = H_row[j];
      max_i = i;
      max_j = j;
    }
    return;
  };

  // alignment
  for (const auto& it : rank_to_node) {
    const auto& char_profile =
        &(pimpl_->sequence_profile[it->code * matrix_width]);

    std::uint32_t i = pimpl_->node_id_to_rank[it->id] + 1;
    std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

    std::int32_t* H_row = &(pimpl_->H[i * matrix_width]);
    std::int32_t* H_pred_row = &(pimpl_->H[pred_i * matrix_width]);

    std::int32_t* F_row = &(pimpl_->F[i * matrix_width]);
    std::int32_t* F_pred_row = &(pimpl_->F[pred_i * matrix_width]);

    std::int32_t* O_row = &(pimpl_->O[i * matrix_width]);
    std::int32_t* O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

    // update F, O and H
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      F_row[j] = std::max(H_pred_row[j] + g_, F_pred_row[j] + e_);
      O_row[j] = std::max(H_pred_row[j] + q_, O_pred_row[j] + c_);
      H_row[j] = H_pred_row[j - 1] + char_profile[j];
    }
    // check other predeccessors
    for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
      pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

      H_pred_row = &(pimpl_->H[pred_i * matrix_width]);
      F_pred_row = &(pimpl_->F[pred_i * matrix_width]);
      O_pred_row = &(pimpl_->O[pred_i * matrix_width]);

      for (std::uint64_t j = 1; j < matrix_width; ++j) {
        F_row[j] = std::max(
            F_row[j],
            std::max(
                H_pred_row[j] + g_,
                F_pred_row[j] + e_));
        O_row[j] = std::max(
            O_row[j],
            std::max(
                H_pred_row[j] + q_,
                O_pred_row[j] + c_));
        H_row[j] = std::max(H_row[j], H_pred_row[j - 1] + char_profile[j]);
      }
    }

    // update E, Q and H
    std::int32_t* E_row = &(pimpl_->E[i * matrix_width]);
    std::int32_t* Q_row = &(pimpl_->Q[i * matrix_width]);
    for (std::uint64_t j = 1; j < matrix_width; ++j) {
      E_row[j] = std::max(H_row[j - 1] + g_, E_row[j - 1] + e_);
      Q_row[j] = std::max(H_row[j - 1] + q_, Q_row[j - 1] + c_);
      H_row[j] = std::max(
        H_row[j],
        std::max(
            std::max(F_row[j], E_row[j]),
            std::max(O_row[j], Q_row[j])));

      if (type_ == AlignmentType::kSW) {
        H_row[j] = std::max(H_row[j], 0);
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kNW &&
          (it->outedges.empty() && j == matrix_width - 1)) {
        update_max_score(H_row, i, j);
      } else if (type_ == AlignmentType::kOV && it->outedges.empty()) {
        update_max_score(H_row, i, j);
      }
    }
  }

  if (max_i == 0 && max_j == 0) {
    return Alignment();
  }
  if (score) {
    *score = max_score;
  }

  // backtrack
  Alignment alignment;
  std::uint32_t i = max_i;
  std::uint32_t j = max_j;

  auto sw_condition = [this, &i, &j, &matrix_width] () -> bool {
    return (pimpl_->H[i * matrix_width + j] == 0) ? false : true;
  };
  auto nw_condition = [&i, &j] () -> bool {
    return (i == 0 && j == 0) ? false : true;
  };
  auto ov_condition = [&i, &j] () -> bool {
    return (i == 0 || j == 0) ? false : true;
  };

  std::uint32_t prev_i = 0;
  std::uint32_t prev_j = 0;

  while ((type_ == AlignmentType::kSW && sw_condition()) ||
         (type_ == AlignmentType::kNW && nw_condition()) ||
         (type_ == AlignmentType::kOV && ov_condition())) {
    auto H_ij = pimpl_->H[i * matrix_width + j];
    bool predecessor_found = false, extend_left = false, extend_up = false;

    if (i != 0 && j != 0) {
      const auto& it = rank_to_node[i - 1];
      std::int32_t match_cost =
        pimpl_->sequence_profile[it->code * matrix_width + j];

      std::uint32_t pred_i = it->inedges.empty() ?
          0 : pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
        prev_i = pred_i;
        prev_j = j - 1;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if (H_ij == pimpl_->H[pred_i * matrix_width + (j - 1)] + match_cost) {
            prev_i = pred_i;
            prev_j = j - 1;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && i != 0) {
      const auto& it = rank_to_node[i - 1];

      std::uint32_t pred_i = it->inedges.empty() ? 0 :
        pimpl_->node_id_to_rank[it->inedges[0]->tail->id] + 1;

      if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||
          (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||
                        H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
        prev_i = pred_i;
        prev_j = j;
        predecessor_found = true;
      } else {
        for (std::uint32_t p = 1; p < it->inedges.size(); ++p) {
          pred_i = pimpl_->node_id_to_rank[it->inedges[p]->tail->id] + 1;

          if ((extend_up |= H_ij == pimpl_->F[pred_i * matrix_width + j] + e_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + g_  ||  // NOLINT
              (extend_up |= H_ij == pimpl_->O[pred_i * matrix_width + j] + c_) ||  // NOLINT
                            H_ij == pimpl_->H[pred_i * matrix_width + j] + q_) {
            prev_i = pred_i;
            prev_j = j;
            predecessor_found = true;
            break;
          }
        }
      }
    }

    if (!predecessor_found && j != 0) {
      if ((extend_left |= H_ij == pimpl_->E[i * matrix_width + j - 1] + e_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + g_  ||
          (extend_left |= H_ij == pimpl_->Q[i * matrix_width + j - 1] + c_) ||
                          H_ij == pimpl_->H[i * matrix_width + j - 1] + q_) {
        prev_i = i;
        prev_j = j - 1;
        predecessor_found = true;
      }
    }

    alignment.emplace_back(
        i == prev_i ? -1 : rank_to_node[i - 1]->id,
        j == prev_j ? -1 : j - 1);

    i = prev_i;
    j = prev_j;

    if (extend_left) {
      while (true) {
        alignment.emplace_back(-1, j - 1);
        --j;
        if (pimpl_->E[i * matrix_width + j] + e_ != pimpl_->E[i * matrix_width + j + 1] &&  // NOLINT
            pimpl_->Q[i * matrix_width + j] + c_ != pimpl_->Q[i * matrix_width + j + 1]) {  // NOLINT
          break;
        }
      }
    } else if (extend_up) {
      while (true) {
        bool stop = true;
        prev_i = 0;
        for (const auto& it : rank_to_node[i - 1]->inedges) {
          std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

          if (pimpl_->F[i * matrix_width + j] == pimpl_->F[pred_i * matrix_width + j] + e_ ||  // NOLINT
              pimpl_->O[i * matrix_width + j] == pimpl_->O[pred_i * matrix_width + j] + c_) {  // NOLINT
            prev_i = pred_i;
            stop = false;
            break;
          }
        }
        if (stop == true) {
          for (const auto& it : rank_to_node[i - 1]->inedges) {
            std::uint32_t pred_i = pimpl_->node_id_to_rank[it->tail->id] + 1;

            if (pimpl_->F[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + g_ ||  // NOLINT
                pimpl_->O[i * matrix_width + j] == pimpl_->H[pred_i * matrix_width + j] + q_) {  // NOLINT
              prev_i = pred_i;
              break;
            }
          }
        }

        alignment.emplace_back(rank_to_node[i - 1]->id, -1);
        i = prev_i;

        if (stop || i == 0) {
          break;
        }
      }
    }
  }

  std::reverse(alignment.begin(), alignment.end());
  return alignment;
}